

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

bool __thiscall
httplib::ClientImpl::write_request
          (ClientImpl *this,Stream *strm,Request *req,bool close_connection,Error *error)

{
  bool bVar1;
  uint uVar2;
  ulong uVar3;
  unsigned_long __val;
  char *pcVar4;
  size_t sVar5;
  Headers *headers_00;
  string *data;
  char *local_290;
  string local_288;
  string *local_268;
  string *path;
  BufferStream bstrm;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_228;
  _Base_ptr local_1e8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1e0;
  _Base_ptr local_1a0;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_198;
  _Base_ptr local_158;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_150;
  _Base_ptr local_110;
  undefined1 local_108 [8];
  string length_1;
  undefined1 local_d0 [8];
  string length;
  undefined1 local_68 [8];
  Headers headers;
  Error *error_local;
  bool close_connection_local;
  Request *req_local;
  Stream *strm_local;
  ClientImpl *this_local;
  
  headers._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)error;
  std::
  multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::multimap((multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_68);
  if (close_connection) {
    std::
    multimap<std::__cxx11::string,std::__cxx11::string,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
    ::emplace<char_const(&)[11],char_const(&)[6]>
              ((multimap<std::__cxx11::string,std::__cxx11::string,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                *)local_68,(char (*) [11])"Connection",(char (*) [6])"close");
  }
  bVar1 = Request::has_header(req,"Host");
  if (!bVar1) {
    uVar2 = (*this->_vptr_ClientImpl[6])();
    if ((uVar2 & 1) == 0) {
      if (this->port_ == 0x50) {
        std::
        multimap<std::__cxx11::string,std::__cxx11::string,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
        ::emplace<char_const(&)[5],std::__cxx11::string_const&>
                  ((multimap<std::__cxx11::string,std::__cxx11::string,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                    *)local_68,(char (*) [5])"Host",&this->host_);
      }
      else {
        std::
        multimap<std::__cxx11::string,std::__cxx11::string,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
        ::emplace<char_const(&)[5],std::__cxx11::string_const&>
                  ((multimap<std::__cxx11::string,std::__cxx11::string,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                    *)local_68,(char (*) [5])"Host",&this->host_and_port_);
      }
    }
    else if (this->port_ == 0x1bb) {
      std::
      multimap<std::__cxx11::string,std::__cxx11::string,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
      ::emplace<char_const(&)[5],std::__cxx11::string_const&>
                ((multimap<std::__cxx11::string,std::__cxx11::string,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                  *)local_68,(char (*) [5])"Host",&this->host_);
    }
    else {
      std::
      multimap<std::__cxx11::string,std::__cxx11::string,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
      ::emplace<char_const(&)[5],std::__cxx11::string_const&>
                ((multimap<std::__cxx11::string,std::__cxx11::string,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                  *)local_68,(char (*) [5])"Host",&this->host_and_port_);
    }
  }
  bVar1 = Request::has_header(req,"Accept");
  if (!bVar1) {
    std::
    multimap<std::__cxx11::string,std::__cxx11::string,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
    ::emplace<char_const(&)[7],char_const(&)[4]>
              ((multimap<std::__cxx11::string,std::__cxx11::string,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                *)local_68,(char (*) [7])"Accept",(char (*) [4])"*/*");
  }
  bVar1 = Request::has_header(req,"User-Agent");
  if (!bVar1) {
    length.field_2._8_8_ =
         std::
         multimap<std::__cxx11::string,std::__cxx11::string,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
         ::emplace<char_const(&)[11],char_const(&)[16]>
                   ((multimap<std::__cxx11::string,std::__cxx11::string,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                     *)local_68,(char (*) [11])"User-Agent",(char (*) [16])"cpp-httplib/0.7");
  }
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    bVar1 = Request::has_header(req,"Content-Type");
    if (!bVar1) {
      length_1.field_2._8_8_ =
           std::
           multimap<std::__cxx11::string,std::__cxx11::string,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
           ::emplace<char_const(&)[13],char_const(&)[11]>
                     ((multimap<std::__cxx11::string,std::__cxx11::string,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                       *)local_68,(char (*) [13])"Content-Type",(char (*) [11])"text/plain");
    }
    bVar1 = Request::has_header(req,"Content-Length");
    if (!bVar1) {
      __val = std::__cxx11::string::size();
      std::__cxx11::to_string((string *)local_108,__val);
      local_110 = (_Base_ptr)
                  std::
                  multimap<std::__cxx11::string,std::__cxx11::string,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                  ::emplace<char_const(&)[15],std::__cxx11::string&>
                            ((multimap<std::__cxx11::string,std::__cxx11::string,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                              *)local_68,(char (*) [15])"Content-Length",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_108);
      std::__cxx11::string::~string((string *)local_108);
    }
  }
  else {
    bVar1 = std::function::operator_cast_to_bool((function *)&req->content_provider_);
    if (bVar1) {
      if ((req->is_chunked_content_provider_ & 1U) == 0) {
        std::__cxx11::to_string((string *)local_d0,req->content_length_);
        std::
        multimap<std::__cxx11::string,std::__cxx11::string,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
        ::emplace<char_const(&)[15],std::__cxx11::string&>
                  ((multimap<std::__cxx11::string,std::__cxx11::string,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                    *)local_68,(char (*) [15])"Content-Length",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0);
        std::__cxx11::string::~string((string *)local_d0);
      }
    }
    else {
      bVar1 = std::operator==(&req->method,"POST");
      if (((bVar1) || (bVar1 = std::operator==(&req->method,"PUT"), bVar1)) ||
         (bVar1 = std::operator==(&req->method,"PATCH"), bVar1)) {
        std::
        multimap<std::__cxx11::string,std::__cxx11::string,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
        ::emplace<char_const(&)[15],char_const(&)[2]>
                  ((multimap<std::__cxx11::string,std::__cxx11::string,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                    *)local_68,(char (*) [15])"Content-Length",(char (*) [2])0x189b42);
      }
    }
  }
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    make_basic_authentication_header
              (&local_150,&this->basic_auth_username_,&this->basic_auth_password_,false);
    local_158 = (_Base_ptr)
                std::
                multimap<std::__cxx11::string,std::__cxx11::string,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                ::insert<std::pair<std::__cxx11::string,std::__cxx11::string>>
                          ((multimap<std::__cxx11::string,std::__cxx11::string,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                            *)local_68,&local_150);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair(&local_150);
  }
  uVar3 = std::__cxx11::string::empty();
  if (((uVar3 & 1) == 0) && (uVar3 = std::__cxx11::string::empty(), (uVar3 & 1) == 0)) {
    make_basic_authentication_header
              (&local_198,&this->proxy_basic_auth_username_,&this->proxy_basic_auth_password_,true);
    local_1a0 = (_Base_ptr)
                std::
                multimap<std::__cxx11::string,std::__cxx11::string,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                ::insert<std::pair<std::__cxx11::string,std::__cxx11::string>>
                          ((multimap<std::__cxx11::string,std::__cxx11::string,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                            *)local_68,&local_198);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair(&local_198);
  }
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    make_bearer_token_authentication_header(&local_1e0,&this->bearer_token_auth_token_,false);
    local_1e8 = (_Base_ptr)
                std::
                multimap<std::__cxx11::string,std::__cxx11::string,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                ::insert<std::pair<std::__cxx11::string,std::__cxx11::string>>
                          ((multimap<std::__cxx11::string,std::__cxx11::string,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                            *)local_68,&local_1e0);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair(&local_1e0);
  }
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    make_bearer_token_authentication_header(&local_228,&this->proxy_bearer_token_auth_token_,true);
    bstrm.position =
         (size_t)std::
                 multimap<std::__cxx11::string,std::__cxx11::string,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                 ::insert<std::pair<std::__cxx11::string,std::__cxx11::string>>
                           ((multimap<std::__cxx11::string,std::__cxx11::string,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                             *)local_68,&local_228);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair(&local_228);
  }
  detail::BufferStream::BufferStream((BufferStream *)&path);
  detail::encode_url(&local_288,&req->path);
  local_268 = &local_288;
  local_290 = (char *)std::__cxx11::string::c_str();
  data = (string *)std::__cxx11::string::c_str();
  headers_00 = (Headers *)&data;
  Stream::write_format<char_const*,char_const*>
            ((Stream *)&path,"%s %s HTTP/1.1\r\n",&local_290,(char **)headers_00);
  detail::write_headers<httplib::Request>
            ((detail *)&path,(Stream *)req,(Request *)local_68,headers_00);
  detail::BufferStream::get_buffer_abi_cxx11_((BufferStream *)&path);
  pcVar4 = (char *)std::__cxx11::string::data();
  sVar5 = std::__cxx11::string::size();
  bVar1 = detail::write_data(strm,pcVar4,sVar5);
  if (!bVar1) {
    *(undefined4 *)headers._M_t._M_impl.super__Rb_tree_header._M_node_count = 5;
    this_local._7_1_ = 0;
  }
  std::__cxx11::string::~string((string *)&local_288);
  detail::BufferStream::~BufferStream((BufferStream *)&path);
  if (bVar1) {
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) == 0) {
      pcVar4 = (char *)std::__cxx11::string::data();
      sVar5 = std::__cxx11::string::size();
      this_local._7_1_ = detail::write_data(strm,pcVar4,sVar5);
    }
    else {
      this_local._7_1_ =
           write_content_with_provider
                     (this,strm,req,
                      (Error *)headers._M_t._M_impl.super__Rb_tree_header._M_node_count);
    }
  }
  std::
  multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~multimap((multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)local_68);
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

inline bool ClientImpl::write_request(Stream &strm, const Request &req,
										  bool close_connection, Error &error) {
		// Prepare additional headers
		Headers headers;
		if (close_connection) { headers.emplace("Connection", "close"); }

		if (!req.has_header("Host")) {
			if (is_ssl()) {
				if (port_ == 443) {
					headers.emplace("Host", host_);
				} else {
					headers.emplace("Host", host_and_port_);
				}
			} else {
				if (port_ == 80) {
					headers.emplace("Host", host_);
				} else {
					headers.emplace("Host", host_and_port_);
				}
			}
		}

		if (!req.has_header("Accept")) { headers.emplace("Accept", "*/*"); }

		if (!req.has_header("User-Agent")) {
			headers.emplace("User-Agent", "cpp-httplib/0.7");
		}

		if (req.body.empty()) {
			if (req.content_provider_) {
				if (!req.is_chunked_content_provider_) {
					auto length = std::to_string(req.content_length_);
					headers.emplace("Content-Length", length);
				}
			} else {
				if (req.method == "POST" || req.method == "PUT" ||
					req.method == "PATCH") {
					headers.emplace("Content-Length", "0");
				}
			}
		} else {
			if (!req.has_header("Content-Type")) {
				headers.emplace("Content-Type", "text/plain");
			}

			if (!req.has_header("Content-Length")) {
				auto length = std::to_string(req.body.size());
				headers.emplace("Content-Length", length);
			}
		}

		if (!basic_auth_password_.empty()) {
			headers.insert(make_basic_authentication_header(
					basic_auth_username_, basic_auth_password_, false));
		}

		if (!proxy_basic_auth_username_.empty() &&
			!proxy_basic_auth_password_.empty()) {
			headers.insert(make_basic_authentication_header(
					proxy_basic_auth_username_, proxy_basic_auth_password_, true));
		}

		if (!bearer_token_auth_token_.empty()) {
			headers.insert(make_bearer_token_authentication_header(
					bearer_token_auth_token_, false));
		}

		if (!proxy_bearer_token_auth_token_.empty()) {
			headers.insert(make_bearer_token_authentication_header(
					proxy_bearer_token_auth_token_, true));
		}

		// Request line and headers
		{
			detail::BufferStream bstrm;

			const auto &path = detail::encode_url(req.path);
			bstrm.write_format("%s %s HTTP/1.1\r\n", req.method.c_str(), path.c_str());

			detail::write_headers(bstrm, req, headers);

			// Flush buffer
			auto &data = bstrm.get_buffer();
			if (!detail::write_data(strm, data.data(), data.size())) {
				error = Error::Write;
				return false;
			}
		}

		// Body
		if (req.body.empty()) {
			return write_content_with_provider(strm, req, error);
		} else {
			return detail::write_data(strm, req.body.data(), req.body.size());
		}

		return true;
	}